

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void check_create_inter_and_list(Am_Object *window,Am_Object *inter,Am_Value_List *accel_list)

{
  anon_union_8_8_ea4c8939_for_value this;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object *this_00;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48 [3];
  undefined1 local_30 [8];
  Am_Value value;
  Am_Value_List *accel_list_local;
  Am_Object *inter_local;
  Am_Object *window_local;
  
  value.value = (anon_union_8_8_ea4c8939_for_value)accel_list;
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(window,0x1e2,4);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if (bVar1) {
    Am_Object::operator=(inter,(Am_Value *)local_30);
  }
  else {
    Am_Object::Create(local_48,(char *)&Am_Accelerator_Inter);
    Am_Object::operator=(inter,local_48);
    Am_Object::~Am_Object(local_48);
    Am_Object::Am_Object(&local_50,inter);
    Am_Object::Add_Part(window,0x1e2,&local_50,0);
    Am_Object::~Am_Object(&local_50);
  }
  pAVar2 = Am_Object::Peek(window,0x1e3,4);
  Am_Value::operator=((Am_Value *)local_30,pAVar2);
  bVar1 = Am_Value::Valid((Am_Value *)local_30);
  if ((bVar1) && (bVar1 = Am_Value_List::Test((Am_Value *)local_30), bVar1)) {
    Am_Value_List::operator=((Am_Value_List *)value.value.wrapper_value,(Am_Value *)local_30);
  }
  else {
    this = value.value;
    Am_Object::Create(&local_58,(char *)&Am_Command);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(&local_58);
    Am_Value_List::Add((Am_Value_List *)this.wrapper_value,pAVar3,Am_TAIL,true);
    Am_Object::~Am_Object(&local_58);
    pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(value.value.wrapper_value);
    this_00 = Am_Object::Add(window,0x1e3,pAVar3,0);
    Am_Object::Set_Inherit_Rule(this_00,0x1e3,Am_LOCAL);
  }
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

static void
check_create_inter_and_list(Am_Object &window, Am_Object &inter,
                            Am_Value_List &accel_list)
{
  Am_Value value;
  value = window.Peek(Am_ACCELERATOR_INTER, Am_NO_DEPENDENCY);
  if (!value.Valid()) {
    Am_INTER_TRACE_PRINT(window, "Creating accel inter for " << window);
    inter = Am_Accelerator_Inter.Create();
    window.Add_Part(Am_ACCELERATOR_INTER, inter);
  } else
    inter = value;
  value = window.Peek(Am_ACCELERATOR_LIST, Am_NO_DEPENDENCY);
  if (value.Valid() && Am_Value_List::Test(value))
    accel_list = value;
  else {
    accel_list.Add(Am_Command.Create(DSTR("dummy"))); //so will be a real list
    window.Add(Am_ACCELERATOR_LIST, accel_list)
        .Set_Inherit_Rule(Am_ACCELERATOR_LIST, Am_LOCAL);
  }
}